

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

void __thiscall
pstore::transaction_base::transaction_base(transaction_base *this,transaction_base *rhs)

{
  uint64_t uVar1;
  
  this->_vptr_transaction_base = (_func_int **)&PTR__transaction_base_00142768;
  this->db_ = rhs->db_;
  uVar1 = rhs->dbsize_;
  this->size_ = rhs->size_;
  this->dbsize_ = uVar1;
  (this->first_).a_ = (rhs->first_).a_;
  (rhs->first_).a_ = 0;
  return;
}

Assistant:

transaction_base::transaction_base (transaction_base && rhs) noexcept
            : db_{rhs.db_}
            , size_{rhs.size_}
            , dbsize_{rhs.dbsize_}
            , first_ (rhs.first_) {
        rhs.first_ = address::null ();

        PSTORE_ASSERT (!rhs.is_open ()); //! OCLINT(PH - don't warn about the assert macro)
    }